

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O2

Type * __thiscall
psy::C::TypeChecker::typeOfStringLiteral(TypeChecker *this,EncodingPrefix encodingSuffix)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  switch(CONCAT71(in_register_00000031,encodingSuffix) & 0xffffffff) {
  case 0:
    return this->u8StrLitTy_;
  case 1:
    return this->uStrLitTy_;
  case 2:
    return this->UStrLitTy_;
  case 3:
    return this->LStrLitTy_;
  case 4:
    return this->strLitTy_;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x380);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,"<empty message>");
    std::endl<char,std::char_traits<char>>(poVar1);
    return (Type *)0x0;
  }
}

Assistant:

const Type* TypeChecker::typeOfStringLiteral(StringLiteral::EncodingPrefix encodingSuffix)
{
    switch (encodingSuffix) {
        case StringLiteral::EncodingPrefix::None:
            return strLitTy_;
        case StringLiteral::EncodingPrefix::u8:
            return u8StrLitTy_;
        case StringLiteral::EncodingPrefix::u:
            return uStrLitTy_;
        case StringLiteral::EncodingPrefix::U:
            return UStrLitTy_;
        case StringLiteral::EncodingPrefix::L:
            return LStrLitTy_;
        default:
            PSY_ASSERT_1(false);
            return nullptr;
    }
}